

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_ClassArray<ON_Texture>::Append(ON_ClassArray<ON_Texture> *this,ON_Texture *x)

{
  int iVar1;
  undefined1 local_220 [8];
  ON_Texture temp;
  int s;
  int newcapacity;
  ON_Texture *x_local;
  ON_ClassArray<ON_Texture> *this_local;
  
  if (this->m_count == this->m_capacity) {
    temp._508_4_ = NewCapacity(this);
    if (((this->m_a != (ON_Texture *)0x0) &&
        (temp.m_blend_order = (int)((long)x - (long)this->m_a >> 9), -1 < temp.m_blend_order)) &&
       (temp.m_blend_order < this->m_capacity)) {
      ON_Texture::ON_Texture((ON_Texture *)local_220);
      ON_Texture::operator=((ON_Texture *)local_220,x);
      Reserve(this,(long)(int)temp._508_4_);
      if (this->m_a == (ON_Texture *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar1 = this->m_count;
        this->m_count = iVar1 + 1;
        ON_Texture::operator=(this->m_a + iVar1,(ON_Texture *)local_220);
      }
      ON_Texture::~ON_Texture((ON_Texture *)local_220);
      return;
    }
    Reserve(this,(long)(int)temp._508_4_);
    if (this->m_a == (ON_Texture *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  ON_Texture::operator=(this->m_a + iVar1,x);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}